

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O2

size_t write_vbyte(FILE *f,uint32_t x)

{
  size_t sVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vbyte_encode_u32(&buf,x);
  sVar1 = fwrite(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,1,
                 (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start,(FILE *)f);
  uVar2 = (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((int)sVar1 == (int)uVar2) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return uVar2;
  }
  quit("writing vbyte to file: %d != %d",sVar1 & 0xffffffff,uVar2 & 0xffffffff);
}

Assistant:

size_t write_vbyte(FILE* f, uint32_t x)
{
    std::vector<uint8_t> buf;
    vbyte_encode_u32(buf, x);
    int ret = fwrite(buf.data(), 1, buf.size(), f);
    if (ret != (int)buf.size()) {
        quit("writing vbyte to file: %d != %d", ret, (int)buf.size());
    }
    return buf.size();
}